

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize_x86.h
# Opt level: O0

int16_t accumulate_eob(__m128i eob)

{
  undefined1 auVar1 [16];
  ushort uVar2;
  ushort uVar4;
  ushort uVar5;
  undefined8 in_XMM0_Qa;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  undefined8 in_XMM0_Qb;
  ushort uVar10;
  undefined1 auVar3 [16];
  __m128i eob_shuffled;
  __m128i eob_local;
  undefined2 local_48;
  undefined2 uStack_46;
  undefined2 uStack_44;
  undefined2 uStack_42;
  undefined2 uStack_40;
  undefined2 uStack_3e;
  undefined2 uStack_3c;
  undefined2 uStack_3a;
  undefined2 local_18;
  undefined2 uStack_16;
  undefined2 uStack_14;
  undefined2 uStack_12;
  undefined2 uStack_10;
  undefined2 uStack_e;
  undefined2 uStack_c;
  undefined2 uStack_a;
  
  local_18 = (short)in_XMM0_Qa;
  uStack_16 = (short)((ulong)in_XMM0_Qa >> 0x10);
  uStack_14 = (short)((ulong)in_XMM0_Qa >> 0x20);
  uStack_12 = (short)((ulong)in_XMM0_Qa >> 0x30);
  uStack_10 = (short)in_XMM0_Qb;
  uStack_e = (short)((ulong)in_XMM0_Qb >> 0x10);
  uStack_c = (short)((ulong)in_XMM0_Qb >> 0x20);
  uStack_a = (short)((ulong)in_XMM0_Qb >> 0x30);
  uVar2 = (ushort)(local_18 < uStack_10) * uStack_10 | (ushort)(local_18 >= uStack_10) * local_18;
  uVar4 = (ushort)(uStack_16 < uStack_e) * uStack_e | (ushort)(uStack_16 >= uStack_e) * uStack_16;
  uVar5 = (ushort)(uStack_14 < uStack_c) * uStack_c | (ushort)(uStack_14 >= uStack_c) * uStack_14;
  uVar6 = (ushort)(uStack_12 < uStack_a) * uStack_a | (ushort)(uStack_12 >= uStack_a) * uStack_12;
  uVar7 = (ushort)(uStack_10 < local_18) * local_18 | (ushort)(uStack_10 >= local_18) * uStack_10;
  uVar8 = (ushort)(uStack_e < uStack_16) * uStack_16 | (ushort)(uStack_e >= uStack_16) * uStack_e;
  uVar9 = (ushort)(uStack_c < local_18) * local_18 | (ushort)(uStack_c >= local_18) * uStack_c;
  uVar10 = (ushort)(uStack_a < uStack_16) * uStack_16 | (ushort)(uStack_a >= uStack_16) * uStack_a;
  auVar3._2_2_ = uVar4;
  auVar3._0_2_ = uVar2;
  auVar3._4_2_ = uVar5;
  auVar3._6_2_ = uVar6;
  auVar3._8_2_ = uVar7;
  auVar3._10_2_ = uVar8;
  auVar3._12_2_ = uVar9;
  auVar3._14_2_ = uVar10;
  auVar3 = pshuflw(auVar3,auVar3,0xe);
  local_48 = auVar3._0_2_;
  uStack_46 = auVar3._2_2_;
  uStack_44 = auVar3._4_2_;
  uStack_42 = auVar3._6_2_;
  uStack_40 = auVar3._8_2_;
  uStack_3e = auVar3._10_2_;
  uStack_3c = auVar3._12_2_;
  uStack_3a = auVar3._14_2_;
  uVar4 = (ushort)((short)uVar4 < uStack_46) * uStack_46 | ((short)uVar4 >= uStack_46) * uVar4;
  auVar1._2_2_ = uVar4;
  auVar1._0_2_ = (ushort)((short)uVar2 < local_48) * local_48 | ((short)uVar2 >= local_48) * uVar2;
  auVar1._4_2_ = (ushort)((short)uVar5 < uStack_44) * uStack_44 |
                 ((short)uVar5 >= uStack_44) * uVar5;
  auVar1._6_2_ = (ushort)((short)uVar6 < uStack_42) * uStack_42 |
                 ((short)uVar6 >= uStack_42) * uVar6;
  auVar1._8_2_ = (ushort)((short)uVar7 < uStack_40) * uStack_40 |
                 ((short)uVar7 >= uStack_40) * uVar7;
  auVar1._10_2_ =
       (ushort)((short)uVar8 < uStack_3e) * uStack_3e | ((short)uVar8 >= uStack_3e) * uVar8;
  auVar1._12_2_ =
       (ushort)((short)uVar9 < uStack_3c) * uStack_3c | ((short)uVar9 >= uStack_3c) * uVar9;
  auVar1._14_2_ =
       (ushort)((short)uVar10 < uStack_3a) * uStack_3a | ((short)uVar10 >= uStack_3a) * uVar10;
  auVar3 = pshuflw(auVar1,auVar1,1);
  eob_local[1]._2_2_ = auVar3._2_2_;
  return (ushort)((short)uVar4 < eob_local[1]._2_2_) * eob_local[1]._2_2_ |
         ((short)uVar4 >= eob_local[1]._2_2_) * uVar4;
}

Assistant:

static inline int16_t accumulate_eob(__m128i eob) {
  __m128i eob_shuffled;
  eob_shuffled = _mm_shuffle_epi32(eob, 0xe);
  eob = _mm_max_epi16(eob, eob_shuffled);
  eob_shuffled = _mm_shufflelo_epi16(eob, 0xe);
  eob = _mm_max_epi16(eob, eob_shuffled);
  eob_shuffled = _mm_shufflelo_epi16(eob, 0x1);
  eob = _mm_max_epi16(eob, eob_shuffled);
  return _mm_extract_epi16(eob, 1);
}